

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O1

LIndex IndexTools::IndividualToJointIndicesArrayStepSize
                 (LIndex *indices,LIndex *step_size,size_t vec_size)

{
  LIndex LVar1;
  ulong uVar2;
  
  if (vec_size != 0) {
    uVar2 = 0;
    LVar1 = 0;
    do {
      LVar1 = LVar1 + step_size[uVar2] * indices[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < vec_size);
    return LVar1;
  }
  return 0;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesArrayStepSize(LIndex* indices,
        const LIndex* step_size, size_t vec_size) 
{
    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    return(jointI);
}